

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

object * __thiscall
jessilib::parser::deserialize_bytes
          (object *__return_storage_ptr__,parser *this,istream *in_stream,
          text_encoding in_read_encoding)

{
  vector<char,_std::allocator<char>_> data;
  char buffer [1024];
  _Vector_base<char,_std::allocator<char>_> local_458;
  char local_438 [1032];
  
  local_458._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_finish = (char *)0x0;
  local_458._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (((byte)in_stream[*(long *)(*(long *)in_stream + -0x18) + 0x20] & 2) == 0) {
    std::istream::read((char *)in_stream,(long)local_438);
    std::vector<char,std::allocator<char>>::insert<char*,void>
              ((vector<char,std::allocator<char>> *)&local_458,
               (const_iterator)local_458._M_impl.super__Vector_impl_data._M_finish,local_438,
               local_438 + *(long *)(in_stream + 8));
  }
  (*this->_vptr_parser[3])
            (__return_storage_ptr__,this,
             (long)local_458._M_impl.super__Vector_impl_data._M_finish -
             (long)local_458._M_impl.super__Vector_impl_data._M_start,
             local_458._M_impl.super__Vector_impl_data._M_start,(ulong)in_read_encoding);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_458);
  return __return_storage_ptr__;
}

Assistant:

object parser::deserialize_bytes(std::istream& in_stream, text_encoding in_read_encoding) {
	std::vector<byte_type> data;

	// Read entire stream into data
	char buffer[1024];
	while(!in_stream.eof()) {
		in_stream.read(buffer, sizeof(buffer));
		data.insert(data.end(), buffer, buffer + in_stream.gcount());
	}

	// Pass data to deserialize
	return deserialize_bytes(bytes_view_type{ &data.front(), data.size() }, in_read_encoding);
}